

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base64_encode_atom.c
# Opt level: O1

void base64_encode_atom(uchar *data,int n,char *out)

{
  uint uVar1;
  char cVar2;
  char cVar3;
  
  uVar1 = (uint)*data << 0x10;
  if (1 < n) {
    uVar1 = uVar1 | (uint)data[1] << 8;
  }
  if (2 < n) {
    uVar1 = uVar1 | data[2];
  }
  *out = "ABCDEFGHIJKLMNOPQRSTUVWXYZabcdefghijklmnopqrstuvwxyz0123456789+/"[uVar1 >> 0x12];
  out[1] = "ABCDEFGHIJKLMNOPQRSTUVWXYZabcdefghijklmnopqrstuvwxyz0123456789+/"[uVar1 >> 0xc & 0x3f];
  cVar2 = '=';
  cVar3 = '=';
  if (1 < n) {
    cVar3 = "ABCDEFGHIJKLMNOPQRSTUVWXYZabcdefghijklmnopqrstuvwxyz0123456789+/"[uVar1 >> 6 & 0x3f];
  }
  out[2] = cVar3;
  if (2 < n) {
    cVar2 = "ABCDEFGHIJKLMNOPQRSTUVWXYZabcdefghijklmnopqrstuvwxyz0123456789+/"[uVar1 & 0x3f];
  }
  out[3] = cVar2;
  return;
}

Assistant:

void base64_encode_atom(const unsigned char *data, int n, char *out)
{
    static const char base64_chars[] =
        "ABCDEFGHIJKLMNOPQRSTUVWXYZabcdefghijklmnopqrstuvwxyz0123456789+/";

    unsigned word;

    word = data[0] << 16;
    if (n > 1)
        word |= data[1] << 8;
    if (n > 2)
        word |= data[2];
    out[0] = base64_chars[(word >> 18) & 0x3F];
    out[1] = base64_chars[(word >> 12) & 0x3F];
    if (n > 1)
        out[2] = base64_chars[(word >> 6) & 0x3F];
    else
        out[2] = '=';
    if (n > 2)
        out[3] = base64_chars[word & 0x3F];
    else
        out[3] = '=';
}